

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MosquitoNet.h
# Opt level: O2

unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
 __thiscall
Enhedron::Test::Impl::Impl_Suite::
context<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>>
          (Impl_Suite *this,string *name,
          unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
          *childContextList,
          unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
          *childContextList_1,
          unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
          *childContextList_2,
          unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
          *childContextList_3,
          unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
          *childContextList_4,
          unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
          *childContextList_5,
          unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
          *childContextList_6,
          unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
          *childContextList_7,
          unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
          *childContextList_8,
          unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
          *childContextList_9,
          unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
          *childContextList_10,
          unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
          *childContextList_11,
          unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
          *childContextList_12)

{
  undefined8 uVar1;
  ContextList contextList;
  _Head_base<0UL,_Enhedron::Test::Impl::Impl_Suite::Context_*,_false> local_38;
  undefined1 local_30 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_20;
  
  aStack_20._8_8_ = 0;
  local_30._8_8_ = 0;
  aStack_20._M_allocated_capacity = 0;
  local_38._M_head_impl =
       (childContextList->_M_t).
       super___uniq_ptr_impl<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
       ._M_t.
       super__Tuple_impl<0UL,_Enhedron::Test::Impl::Impl_Suite::Context_*,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
       .super__Head_base<0UL,_Enhedron::Test::Impl::Impl_Suite::Context_*,_false>._M_head_impl;
  (childContextList->_M_t).
  super___uniq_ptr_impl<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
  ._M_t.
  super__Tuple_impl<0UL,_Enhedron::Test::Impl::Impl_Suite::Context_*,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
  .super__Head_base<0UL,_Enhedron::Test::Impl::Impl_Suite::Context_*,_false>._M_head_impl =
       (Context *)0x0;
  makeContextList<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>>
            ((vector<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>,_std::allocator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>_>_>
              *)(local_30 + 8),
             (unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>
              *)&local_38,childContextList_1,childContextList_2,childContextList_3,
             childContextList_4,childContextList_5,childContextList_6,childContextList_7,
             childContextList_8,childContextList_9,childContextList_10,childContextList_11,
             childContextList_12);
  if (local_38._M_head_impl != (Context *)0x0) {
    (*(local_38._M_head_impl)->_vptr_Context[1])();
  }
  local_38._M_head_impl = (Context *)0x0;
  ::std::
  make_unique<Enhedron::Test::Impl::Impl_Suite::NodeContext,std::__cxx11::string_const&,std::vector<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>,std::allocator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>>>>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
             (vector<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>,_std::allocator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>_>_>
              *)name);
  uVar1 = local_30._0_8_;
  local_30._0_8_ = (pointer)0x0;
  *(undefined8 *)this = uVar1;
  std::
  unique_ptr<Enhedron::Test::Impl::Impl_Suite::NodeContext,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::NodeContext>_>
  ::~unique_ptr((unique_ptr<Enhedron::Test::Impl::Impl_Suite::NodeContext,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::NodeContext>_>
                 *)local_30);
  std::
  vector<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>,_std::allocator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>_>_>
  ::~vector((vector<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>,_std::allocator<std::unique_ptr<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>_>_>_>
             *)(local_30 + 8));
  return (__uniq_ptr_data<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>,_true,_true>
          )(__uniq_ptr_data<Enhedron::Test::Impl::Impl_Suite::Context,_std::default_delete<Enhedron::Test::Impl::Impl_Suite::Context>,_true,_true>
            )this;
}

Assistant:

unique_ptr<Context> context(const string& name, ContextListType&&... childContextList) {
        ContextList contextList;
        makeContextList(out(contextList), forward<ContextListType>(childContextList)...);

        return make_unique<NodeContext>(name, move(contextList));
    }